

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix3f> *value)

{
  bool bVar1;
  matrix3f local_38;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    local_38.m[0][0] = 1.0;
    local_38.m[0][1] = 0.0;
    local_38.m[0][2] = 0.0;
    local_38.m[1][0] = 0.0;
    local_38.m[1][1] = 1.0;
    local_38.m[1][2] = 0.0;
    local_38.m[2][0] = 0.0;
    local_38.m[2][1] = 0.0;
    local_38.m[2][2] = 1.0;
    bVar1 = ParseMatrix(this,&local_38);
    if (bVar1) {
      *(undefined8 *)&value->contained = local_38.m[0]._0_8_;
      *(undefined8 *)((long)&value->contained + 8) = local_38.m._8_8_;
      *(undefined8 *)((long)&value->contained + 0x10) = local_38.m[1]._4_8_;
      *(undefined8 *)((long)&value->contained + 0x18) = local_38.m[2]._0_8_;
      *(float *)((long)&value->contained + 0x20) = local_38.m[2][2];
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix3f> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix3f v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}